

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# N.h
# Opt level: O0

int __thiscall N::connect(N *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  CIt<__gnu_cxx::__normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_>,_N> __first;
  uint uVar1;
  int iVar2;
  size_type sVar3;
  reference ppNVar4;
  reference pvVar5;
  __normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_> this_00;
  undefined4 in_register_00000034;
  value_type pNVar7;
  bool bVar8;
  undefined1 in_stack_00000000 [16];
  undefined1 in_stack_00000010 [32];
  int i;
  int offset;
  vector<N_*,_std::allocator<N_*>_> *in_stack_ffffffffffffff08;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffff10;
  __normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_> *in_stack_ffffffffffffff18;
  vector<N_*,_std::allocator<N_*>_> *in_stack_ffffffffffffff20;
  CIt<__gnu_cxx::__normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_>,_N>
  *in_stack_ffffffffffffff40;
  CIt<__gnu_cxx::__normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_>,_N> local_78;
  CIt<__gnu_cxx::__normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_>,_N> local_58;
  N **local_38;
  const_iterator in_stack_ffffffffffffffd8;
  int local_18;
  N *pNVar9;
  iterator iVar6;
  
  pNVar7 = (value_type)CONCAT44(in_register_00000034,__fd);
  pNVar9 = this;
  uVar1 = CIt<__gnu_cxx::__normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_>,_N>::size
                    (in_stack_ffffffffffffff40);
  if (uVar1 == 0) {
    iVar2 = 0;
  }
  else {
    local_18 = 0;
    while( true ) {
      sVar3 = std::vector<N_*,_std::allocator<N_*>_>::size(&this->ps);
      bVar8 = false;
      if ((ulong)(long)local_18 < sVar3) {
        ppNVar4 = std::vector<N_*,_std::allocator<N_*>_>::operator[](&this->ps,(long)local_18);
        bVar8 = *ppNVar4 != pNVar7;
      }
      if (!bVar8) break;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                (&this->osi,(long)local_18);
      local_18 = local_18 + 1;
    }
    sVar3 = std::vector<N_*,_std::allocator<N_*>_>::size(&this->ps);
    if ((long)local_18 == sVar3) {
      std::vector<N_*,_std::allocator<N_*>_>::push_back
                (in_stack_ffffffffffffff20,(value_type *)in_stack_ffffffffffffff18);
      CIt<__gnu_cxx::__normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_>,_N>::size
                (in_stack_ffffffffffffff40);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (in_stack_ffffffffffffff10,(value_type_conflict1 *)in_stack_ffffffffffffff08);
    }
    else {
      pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&this->osi,(long)local_18);
      *pvVar5 = *pvVar5 + 1;
    }
    local_38 = (N **)std::vector<N_*,_std::allocator<N_*>_>::begin(in_stack_ffffffffffffff08);
    this_00 = __gnu_cxx::__normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_>::operator+
                        (in_stack_ffffffffffffff18,(difference_type)in_stack_ffffffffffffff10);
    __gnu_cxx::__normal_iterator<N*const*,std::vector<N*,std::allocator<N*>>>::
    __normal_iterator<N**>
              ((__normal_iterator<N_*const_*,_std::vector<N_*,_std::allocator<N_*>_>_> *)
               in_stack_ffffffffffffff10,
               (__normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_> *)
               in_stack_ffffffffffffff08);
    CIt<__gnu_cxx::__normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_>,_N>::begin
              (&local_58,
               (CIt<__gnu_cxx::__normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_>,_N>
                *)&stack0x00000008);
    CIt<__gnu_cxx::__normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_>,_N>::end
              (&local_78,
               (CIt<__gnu_cxx::__normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_>,_N>
                *)&stack0x00000008);
    __first._end._M_current = (N **)pNVar9;
    __first._start._M_current = (N **)pNVar7;
    __first._16_16_ = in_stack_00000000;
    iVar6 = std::vector<N*,std::allocator<N*>>::
            insert<CIt<__gnu_cxx::__normal_iterator<N**,std::vector<N*,std::allocator<N*>>>,N>,void>
                      (this_00._M_current,in_stack_ffffffffffffffd8,__first,
                       (CIt<__gnu_cxx::__normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_>,_N>
                        )in_stack_00000010);
    iVar2 = (int)iVar6._M_current;
  }
  return iVar2;
}

Assistant:

void connect(N* p, nodeit ns) {
        if (ns.size() == 0) return;
        int offset = 0, i = 0;
        while (i < ps.size() and ps[i] != p) offset += osi[i++];

        if (i == ps.size()) {ps.push_back(p); osi.push_back(ns.size());}
        else ++osi[i];

        os.insert(os.begin() + offset, ns.begin(), ns.end());
    }